

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

Promise<int> __thiscall kj::UnixEventPort::onChildExit(UnixEventPort *this,Maybe<int> *pid)

{
  bool bVar1;
  Own<kj::UnixEventPort::ChildSet,_std::nullptr_t> *pOVar2;
  Maybe<int> *in_RDX;
  Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_> local_88;
  undefined1 local_78 [8];
  Own<kj::UnixEventPort::ChildSet,_std::nullptr_t> newChildSet;
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  Own<kj::UnixEventPort::ChildSet,_std::nullptr_t> *c;
  Own<kj::UnixEventPort::ChildSet,_std::nullptr_t> *_c292;
  ChildSet *cs;
  Fault local_30;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  Maybe<int> *pid_local;
  UnixEventPort *this_local;
  
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (bool *)&kj::(anonymous_namespace)::capturedChildExit);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&f);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[66]>
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x121,FAILED,"capturedChildExit",
               "_kjCondition,\"must call UnixEventPort::captureChildExit() to use onChildExit().\"",
               (DebugExpression<bool_&> *)&f,
               (char (*) [66])"must call UnixEventPort::captureChildExit() to use onChildExit().");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  pOVar2 = kj::_::readMaybe<kj::UnixEventPort::ChildSet,decltype(nullptr)>
                     ((Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_> *)(pid + 0x1d));
  if (pOVar2 == (Own<kj::UnixEventPort::ChildSet,_std::nullptr_t> *)0x0) {
    f_1.exception._6_1_ = (kj::(anonymous_namespace)::threadClaimedChildExits ^ 0xff) & 1;
    f_1.exception._7_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f_1.exception + 6))
    ;
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                      ((DebugExpression *)((long)&f_1.exception + 7));
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[62]>
                ((Fault *)&newChildSet.ptr,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0x12a,FAILED,"!threadClaimedChildExits",
                 "_kjCondition,\"only one UnixEvertPort per process may listen for child exits\"",
                 (DebugExpression<bool> *)((long)&f_1.exception + 7),
                 (char (*) [62])"only one UnixEvertPort per process may listen for child exits");
      kj::_::Debug::Fault::fatal((Fault *)&newChildSet.ptr);
    }
    kj::(anonymous_namespace)::threadClaimedChildExits = 1;
    heap<kj::UnixEventPort::ChildSet>();
    _c292 = (Own<kj::UnixEventPort::ChildSet,_std::nullptr_t> *)
            kj::Own::operator_cast_to_ChildSet_((Own *)local_78);
    pOVar2 = mv<kj::Own<kj::UnixEventPort::ChildSet,decltype(nullptr)>>
                       ((Own<kj::UnixEventPort::ChildSet,_std::nullptr_t> *)local_78);
    Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_>::Maybe(&local_88,pOVar2);
    Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_>::operator=
              ((Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_> *)(pid + 0x1d),
               &local_88);
    Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_>::~Maybe(&local_88);
    Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>::~Own
              ((Own<kj::UnixEventPort::ChildSet,_std::nullptr_t> *)local_78);
  }
  else {
    _c292 = (Own<kj::UnixEventPort::ChildSet,_std::nullptr_t> *)
            kj::Own::operator_cast_to_ChildSet_((Own *)pOVar2);
  }
  newAdaptedPromise<int,kj::UnixEventPort::ChildExitPromiseAdapter,kj::UnixEventPort::ChildSet&,kj::Maybe<int>&>
            ((kj *)this,(ChildSet *)_c292,in_RDX);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<int> UnixEventPort::onChildExit(Maybe<pid_t>& pid) {
  KJ_REQUIRE(capturedChildExit,
      "must call UnixEventPort::captureChildExit() to use onChildExit().");

  ChildSet* cs;
  KJ_IF_SOME(c, childSet) {
    cs = c;
  } else {
    // In theory we should do an atomic compare-and-swap on threadClaimedChildExits, but this is
    // for debug purposes only so it's not a big deal.
    KJ_REQUIRE(!threadClaimedChildExits,
        "only one UnixEvertPort per process may listen for child exits");
    threadClaimedChildExits = true;

    auto newChildSet = kj::heap<ChildSet>();
    cs = newChildSet;
    childSet = kj::mv(newChildSet);
  }